

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_first_steps_with_bindings_override.cpp
# Opt level: O0

void __thiscall
app::app(app *this,controller *param_1,
        vector<std::unique_ptr<iclient,_std::default_delete<iclient>_>,_std::allocator<std::unique_ptr<iclient,_std::default_delete<iclient>_>_>_>
        *v)

{
  size_type sVar1;
  reference pvVar2;
  pointer piVar3;
  long local_50;
  long local_40;
  vector<std::unique_ptr<iclient,_std::default_delete<iclient>_>,_std::allocator<std::unique_ptr<iclient,_std::default_delete<iclient>_>_>_>
  *v_local;
  controller *param_1_local;
  app *this_local;
  
  sVar1 = std::
          vector<std::unique_ptr<iclient,_std::default_delete<iclient>_>,_std::allocator<std::unique_ptr<iclient,_std::default_delete<iclient>_>_>_>
          ::size(v);
  if (sVar1 != 2) {
    __assert_fail("2 == v.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/tutorial/basic_first_steps_with_bindings_override.cpp"
                  ,0x41,"app::app(controller &, std::vector<std::unique_ptr<iclient>>)");
  }
  pvVar2 = std::
           vector<std::unique_ptr<iclient,_std::default_delete<iclient>_>,_std::allocator<std::unique_ptr<iclient,_std::default_delete<iclient>_>_>_>
           ::operator[](v,0);
  piVar3 = std::unique_ptr<iclient,_std::default_delete<iclient>_>::get(pvVar2);
  if (piVar3 == (pointer)0x0) {
    local_40 = 0;
  }
  else {
    local_40 = __dynamic_cast(piVar3,&iclient::typeinfo,&user::typeinfo,0);
  }
  if (local_40 != 0) {
    pvVar2 = std::
             vector<std::unique_ptr<iclient,_std::default_delete<iclient>_>,_std::allocator<std::unique_ptr<iclient,_std::default_delete<iclient>_>_>_>
             ::operator[](v,1);
    piVar3 = std::unique_ptr<iclient,_std::default_delete<iclient>_>::get(pvVar2);
    if (piVar3 == (pointer)0x0) {
      local_50 = 0;
    }
    else {
      local_50 = __dynamic_cast(piVar3,&iclient::typeinfo,&timer::typeinfo,0);
    }
    if (local_50 != 0) {
      return;
    }
    __assert_fail("dynamic_cast<timer*>(v[1].get())",
                  "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/tutorial/basic_first_steps_with_bindings_override.cpp"
                  ,0x43,"app::app(controller &, std::vector<std::unique_ptr<iclient>>)");
  }
  __assert_fail("dynamic_cast<user*>(v[0].get())",
                "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/tutorial/basic_first_steps_with_bindings_override.cpp"
                ,0x42,"app::app(controller &, std::vector<std::unique_ptr<iclient>>)");
}

Assistant:

app(controller&, std::vector<std::unique_ptr<iclient>> v) {
    assert(2 == v.size());
    assert(dynamic_cast<user*>(v[0].get()));
    assert(dynamic_cast<timer*>(v[1].get()));
  }